

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInteger.cpp
# Opt level: O2

int __thiscall BigIntegerLibrary::BigInteger::compare(BigInteger *this,BigInteger *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  bVar1 = other->isNegative;
  if (this->isNegative == true) {
    if ((bVar1 & 1U) == 0) {
      return 0xffffffff;
    }
  }
  else if ((bVar1 & 1U) != 0) {
    return 1;
  }
  bVar6 = this->isNegative & bVar1;
  uVar7 = -(uint)bVar6 | 1;
  piVar4 = (this->num).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  uVar9 = (long)(this->num).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
  piVar5 = (other->num).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(other->num).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
  if (uVar8 < uVar9) {
    return uVar7;
  }
  if (uVar8 <= uVar9) {
    uVar9 = uVar9 & 0xffffffff;
    do {
      if ((int)uVar9 < 1) {
        return 0;
      }
      iVar2 = piVar4[uVar9 - 1];
      iVar3 = piVar5[uVar9 - 1];
      if (iVar3 < iVar2) {
        return uVar7;
      }
      uVar9 = uVar9 - 1;
    } while (iVar3 <= iVar2);
  }
  return bVar6 - 1 | 1;
}

Assistant:

int BigInteger::compare(const BigInteger& other) const {
        int sign = 1;
        if (isNegative && other.isNegative) {
            sign = -1;
        }
        if (isNegative && !other.isNegative) { // a < b
            return -1;
        }
        if (other.isNegative && !isNegative) { // a > b
            return 1;
        }
        if (num.size() > other.num.size()) { // a > b
            return sign;
        }
        if (num.size() < other.num.size()) { // a < b
            return -sign;
        }
        for (int i = (int) num.size() - 1; i >= 0; --i) {
            if (num[i] > other.num[i]) { // a > b
                return sign;
            }
            if (num[i] < other.num[i]) { // a < b
                return -sign;
            }
        }
        return 0; // a == b
    }